

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateDictionary::IsHiddenSection(TemplateDictionary *this,TemplateString *name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar1;
  int iVar2;
  bool bVar3;
  TemplateId local_40;
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *local_38;
  SectionDict *sections;
  TemplateDictionary *local_28;
  TemplateDictionary *d;
  TemplateString *name_local;
  TemplateDictionary *this_local;
  
  local_28 = this;
  d = (TemplateDictionary *)name;
  name_local = (TemplateString *)this;
  while( true ) {
    if (local_28 == (TemplateDictionary *)0x0) {
      if (this->template_global_dict_owner_ == (TemplateDictionary *)0x0) {
        __assert_fail("template_global_dict_owner_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                      ,0x3a4,
                      "virtual bool ctemplate::TemplateDictionary::IsHiddenSection(const TemplateString &) const"
                     );
      }
      if ((this->template_global_dict_owner_->template_global_dict_ != (TemplateDictionary *)0x0) &&
         (this->template_global_dict_owner_->template_global_dict_->section_dict_ !=
          (SectionDict *)0x0)) {
        psVar1 = this->template_global_dict_owner_->template_global_dict_->section_dict_;
        local_38 = psVar1;
        local_40 = TemplateString::GetGlobalId((TemplateString *)d);
        iVar2 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
                ::count(psVar1,&local_40);
        if (iVar2 != 0) {
          return false;
        }
      }
      return true;
    }
    bVar3 = false;
    if (local_28->section_dict_ != (SectionDict *)0x0) {
      psVar1 = local_28->section_dict_;
      sections = (SectionDict *)TemplateString::GetGlobalId((TemplateString *)d);
      iVar2 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::count(psVar1,(key_type *)&sections);
      bVar3 = iVar2 != 0;
    }
    if (bVar3) break;
    local_28 = local_28->parent_dict_;
  }
  return false;
}

Assistant:

bool TemplateDictionary::IsHiddenSection(const TemplateString& name) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->section_dict_ &&
        d->section_dict_->count(name.GetGlobalId()))
      return false;
  }
  assert(template_global_dict_owner_ != NULL);
  if (template_global_dict_owner_->template_global_dict_ &&
      template_global_dict_owner_->template_global_dict_->section_dict_) {
    SectionDict* sections =
        template_global_dict_owner_->template_global_dict_->section_dict_;
    if (sections->count(name.GetGlobalId())) {
      return false;
    }
  }
  return true;
}